

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

Array<unsigned_char> * __thiscall
asl::Array<unsigned_char>::reserve(Array<unsigned_char> *this,int m)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  int *piVar5;
  undefined8 *puVar6;
  int __fd;
  size_t __size;
  uint uVar7;
  int *__dest;
  uchar *__src;
  
  __src = this->_a;
  uVar1 = *(uint *)(__src + -0xc);
  if ((int)uVar1 < m) {
    uVar7 = uVar1 * 2;
    if ((int)(uVar1 * 2) <= m) {
      uVar7 = m;
    }
    iVar2 = *(int *)(__src + -0x10);
    if (uVar1 < 0x800) {
      pvVar4 = malloc((ulong)(uVar7 + 0x10));
      if (pvVar4 == (void *)0x0) {
LAB_0011ea94:
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = dup2;
        __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      __dest = (int *)((long)pvVar4 + 0x10);
      if (iVar2 <= m) {
        m = iVar2;
      }
      memcpy(__dest,__src,(long)m);
      __fd = (int)__src;
    }
    else {
      dup(this,m);
      iVar3 = *(int *)(this->_a + -8);
      __size = (long)(int)uVar7 + 0x10;
      piVar5 = (int *)realloc(this->_a + -0x10,__size);
      __fd = (int)__size;
      if (piVar5 == (int *)0x0) goto LAB_0011ea94;
      __dest = piVar5 + 4;
      this->_a = (uchar *)__dest;
      piVar5[2] = iVar3;
      piVar5[1] = uVar7;
      *piVar5 = iVar2;
      uVar7 = uVar1;
    }
    if (uVar7 != uVar1) {
      dup(this,__fd);
      iVar3 = *(int *)(this->_a + -8);
      free(this->_a + -0x10);
      this->_a = (uchar *)__dest;
      __dest[-2] = iVar3;
      __dest[-3] = uVar7;
      __dest[-4] = iVar2;
    }
  }
  return this;
}

Assistant:

Array<T>& Array<T>::reserve(int m)
{
	int s=d().s;
	if (m <= s)
		return *this;
	int s1 = (m > s)? max(8*s/4, m) : s;
	T* b = _a;
	int n=d().n;
	if(s1 != s && s*sizeof(T) < 2048)
	{
		char* p = (char*) malloc( s1*sizeof(T)+sizeof(Data) );
		if(!p)
			ASL_BAD_ALLOC();
		b = (T*) ( p + sizeof(Data) );
		int i = min(m,n), j = sizeof(T), k = i*j;
		memcpy((char*)b, _a, k);
	}
	else if(s1 != s)
	{
		dup();
		int   rc = d().rc;
		ASL_RC_FREE();
		char* p = (char*) realloc( (char*)_a-sizeof(Data), s1*sizeof(T)+sizeof(Data) );
		if(!p)
			ASL_BAD_ALLOC();
		b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		d().rc = rc;
		d().s = s1;
		d().n = n;
		s1 = s;
	}
	if(s1 != s)
	{
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		char* p = (char*)_a - sizeof(Data);
		::free(p);
		_a = b;
		ASL_RC_INIT();
		d().rc = rc;
		d().s = s1;
		d().n = n;
	}
	return *this;
}